

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O0

bool __thiscall ServerManager::freeServer(ServerManager *this,string_view serverConfig)

{
  bool bVar1;
  reference this_00;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  const_iterator local_60;
  size_t local_58;
  char *local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
  local_38;
  __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
  local_30;
  iterator itr;
  ServerManager *this_local;
  string_view serverConfig_local;
  
  itr._M_current = (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)this;
  local_30._M_current =
       (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)
       std::
       vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
       ::begin(&this->m_servers);
  while( true ) {
    local_38._M_current =
         (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)
         std::
         vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
         ::end(&this->m_servers);
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
                      (&local_30,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
              ::operator*(&local_30);
    std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>::operator->(this_00);
    lhs = (basic_string_view<char,_std::char_traits<char>_>)Jupiter::IRC::Client::getConfigSection()
    ;
    local_58 = serverConfig._M_len;
    local_50 = serverConfig._M_str;
    local_48 = lhs;
    bVar1 = jessilib::equalsi<char,char>(lhs,serverConfig);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
    ::operator++(&local_30);
  }
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>const*,std::vector<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>,std::allocator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>>>
  ::__normal_iterator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>*>
            ((__normal_iterator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>const*,std::vector<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>,std::allocator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>>>
              *)&local_60,&local_30);
  std::
  vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
  ::erase(&this->m_servers,local_60);
  return true;
}

Assistant:

bool ServerManager::freeServer(std::string_view serverConfig) {
	for (auto itr = m_servers.begin(); itr != m_servers.end(); ++itr) {
		if (jessilib::equalsi((*itr)->getConfigSection(), serverConfig)) {
			m_servers.erase(itr);
			return true;
		}
	}

	return false;
}